

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureLevelCase::test
          (TextureLevelCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  bool bVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  int local_66c;
  bool local_659;
  GetNameFunc local_648;
  int local_640;
  string local_638;
  allocator<char> local_611;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  GLenum local_58c;
  int local_588;
  deUint32 err_5;
  int offsetNdx;
  GLint ref_2;
  int ndx_2;
  int numConversionIterations;
  float nonSignificantOffsets [4];
  GetNameFunc local_558;
  int local_550;
  string local_548;
  allocator<char> local_521;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  GLenum local_49c;
  int local_498;
  deUint32 err_4;
  GLint ref_1;
  int ndx_1;
  int local_488;
  GetNameFunc local_480;
  int local_478;
  string local_470;
  allocator<char> local_449;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  GLenum local_3c4;
  GetNameFunc p_Stack_3c0;
  deUint32 err_3;
  int local_3b8;
  GetNameFunc local_3b0;
  int local_3a8;
  string local_3a0;
  allocator<char> local_379;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  GLenum local_2f8;
  deUint32 local_2f4;
  deUint32 err_2;
  GLuint uRef;
  GLint ref;
  int ndx;
  Random rnd;
  int numIterations;
  allocator<char> local_2a9;
  string local_2a8;
  ScopedLogSection local_288;
  ScopedLogSection section_2;
  TestLog *local_270;
  int local_268;
  string local_260;
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  GLenum local_1b4;
  GetNameFunc p_Stack_1b0;
  deUint32 err_1;
  int local_1a8;
  GetNameFunc local_1a0;
  int local_198;
  string local_190;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  GLenum local_e8;
  allocator<char> local_e1;
  deUint32 err;
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  int initialValue;
  bool isPureCase;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  TextureLevelCase *this_local;
  
  bVar1 = isPureIntTester((this->super_TextureTest).m_tester);
  local_659 = true;
  if (!bVar1) {
    local_659 = isPureUintTester((this->super_TextureTest).m_tester);
  }
  section.m_log._7_1_ = local_659;
  if ((this->super_TextureTest).m_pname == 0x813c) {
    local_66c = 0;
  }
  else {
    local_66c = -1;
    if ((this->super_TextureTest).m_pname == 0x813d) {
      local_66c = 1000;
    }
  }
  section.m_log._0_4_ = local_66c;
  if (local_659 == false) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Initial",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar3,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (int)section.m_log,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  }
  if (((this->super_TextureTest).m_target == 0x9100) ||
     ((this->super_TextureTest).m_target == 0x9102)) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Set",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"Set",&local_e1);
    tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_b8,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    glu::CallLogWrapper::glTexParameteri
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0);
    do {
      local_e8 = glu::CallLogWrapper::glGetError(gl);
      if (local_e8 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"Got Error ",&local_169);
        EVar4 = glu::getErrorStr(local_e8);
        p_Stack_1b0 = EVar4.m_getName;
        local_1a8 = EVar4.m_value;
        local_1a0 = p_Stack_1b0;
        local_198 = local_1a8;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_190,&local_1a0);
        std::operator+(&local_148,&local_168,&local_190);
        std::operator+(&local_128,&local_148,": ");
        std::operator+(&local_108,&local_128,"glTexParameteri");
        tcu::ResultCollector::fail(result,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
               (this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterf
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0.0);
    do {
      local_1b4 = glu::CallLogWrapper::glGetError(gl);
      if (local_1b4 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"Got Error ",&local_239);
        EVar4 = glu::getErrorStr(local_1b4);
        section_2.m_log = (TestLog *)EVar4.m_getName;
        local_268 = EVar4.m_value;
        local_270 = section_2.m_log;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_270);
        std::operator+(&local_218,&local_238,&local_260);
        std::operator+(&local_1f8,&local_218,": ");
        std::operator+(&local_1d8,&local_1f8,"glTexParameterf");
        tcu::ResultCollector::fail(result,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
               (this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  }
  else {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Set",&local_2a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&numIterations,"Set",(allocator<char> *)((long)&rnd.m_rnd.w + 3));
    tcu::ScopedLogSection::ScopedLogSection(&local_288,pTVar3,&local_2a8,(string *)&numIterations);
    std::__cxx11::string::~string((string *)&numIterations);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rnd.m_rnd.w + 3));
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    rnd.m_rnd.z = 0x14;
    de::Random::Random((Random *)&ref,0xabcdef);
    if ((section.m_log._7_1_ & 1) == 0) {
      for (err_4 = 0; (int)err_4 < 0x14; err_4 = err_4 + 1) {
        local_498 = de::Random::getInt((Random *)&ref,0,64000);
        glu::CallLogWrapper::glTexParameteri
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,local_498
                  );
        do {
          local_49c = glu::CallLogWrapper::glGetError(gl);
          if (local_49c != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_520,"Got Error ",&local_521);
            EVar4 = glu::getErrorStr(local_49c);
            nonSignificantOffsets._8_8_ = EVar4.m_getName;
            local_550 = EVar4.m_value;
            local_558 = (GetNameFunc)nonSignificantOffsets._8_8_;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_548,&local_558);
            std::operator+(&local_500,&local_520,&local_548);
            std::operator+(&local_4e0,&local_500,": ");
            std::operator+(&local_4c0,&local_4e0,"glTexParameteri");
            tcu::ResultCollector::fail(result,&local_4c0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::__cxx11::string::~string((string *)&local_500);
            std::__cxx11::string::~string((string *)&local_548);
            std::__cxx11::string::~string((string *)&local_520);
            std::allocator<char>::~allocator(&local_521);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        StateQueryUtil::verifyStateTextureParamInteger
                  (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   local_498,(this->super_TextureTest).m_type);
      }
      _ndx_2 = 0xbe800000bee66666;
      nonSignificantOffsets[0] = 0.0;
      nonSignificantOffsets[1] = 0.45;
      ref_2 = 0x1e;
      for (offsetNdx = 0; offsetNdx < 0x1e; offsetNdx = offsetNdx + 1) {
        err_5 = de::Random::getInt((Random *)&ref,1,64000);
        for (local_588 = 0; local_588 < 4; local_588 = local_588 + 1) {
          glu::CallLogWrapper::glTexParameterf
                    (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                     (float)(int)err_5 + (float)(&ndx_2)[local_588]);
          do {
            local_58c = glu::CallLogWrapper::glGetError(gl);
            if (local_58c != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_610,"Got Error ",&local_611);
              EVar4 = glu::getErrorStr(local_58c);
              local_648 = EVar4.m_getName;
              local_640 = EVar4.m_value;
              tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_638,&local_648);
              std::operator+(&local_5f0,&local_610,&local_638);
              std::operator+(&local_5d0,&local_5f0,": ");
              std::operator+(&local_5b0,&local_5d0,"glTexParameterf");
              tcu::ResultCollector::fail(result,&local_5b0);
              std::__cxx11::string::~string((string *)&local_5b0);
              std::__cxx11::string::~string((string *)&local_5d0);
              std::__cxx11::string::~string((string *)&local_5f0);
              std::__cxx11::string::~string((string *)&local_638);
              std::__cxx11::string::~string((string *)&local_610);
              std::allocator<char>::~allocator(&local_611);
            }
            dVar2 = ::deGetFalse();
          } while (dVar2 != 0);
          StateQueryUtil::verifyStateTextureParamInteger
                    (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                     err_5,(this->super_TextureTest).m_type);
        }
      }
    }
    else {
      for (uRef = 0; (int)uRef < 0x14; uRef = uRef + 1) {
        local_2f4 = de::Random::getInt((Random *)&ref,0,64000);
        err_2 = local_2f4;
        bVar1 = isPureIntTester((this->super_TextureTest).m_tester);
        if (bVar1) {
          glu::CallLogWrapper::glTexParameterIiv
                    (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                     (GLint *)&err_2);
          do {
            local_2f8 = glu::CallLogWrapper::glGetError(gl);
            if (local_2f8 != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_378,"Got Error ",&local_379);
              EVar4 = glu::getErrorStr(local_2f8);
              p_Stack_3c0 = EVar4.m_getName;
              local_3b8 = EVar4.m_value;
              local_3b0 = p_Stack_3c0;
              local_3a8 = local_3b8;
              tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_3a0,&local_3b0);
              std::operator+(&local_358,&local_378,&local_3a0);
              std::operator+(&local_338,&local_358,": ");
              std::operator+(&local_318,&local_338,"glTexParameterIiv");
              tcu::ResultCollector::fail(result,&local_318);
              std::__cxx11::string::~string((string *)&local_318);
              std::__cxx11::string::~string((string *)&local_338);
              std::__cxx11::string::~string((string *)&local_358);
              std::__cxx11::string::~string((string *)&local_3a0);
              std::__cxx11::string::~string((string *)&local_378);
              std::allocator<char>::~allocator(&local_379);
            }
            dVar2 = ::deGetFalse();
          } while (dVar2 != 0);
        }
        else {
          glu::CallLogWrapper::glTexParameterIuiv
                    (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                     &local_2f4);
          do {
            local_3c4 = glu::CallLogWrapper::glGetError(gl);
            if (local_3c4 != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_448,"Got Error ",&local_449);
              EVar4 = glu::getErrorStr(local_3c4);
              _ref_1 = EVar4.m_getName;
              local_488 = EVar4.m_value;
              local_480 = _ref_1;
              local_478 = local_488;
              tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_470,&local_480);
              std::operator+(&local_428,&local_448,&local_470);
              std::operator+(&local_408,&local_428,": ");
              std::operator+(&local_3e8,&local_408,"glTexParameterIuiv");
              tcu::ResultCollector::fail(result,&local_3e8);
              std::__cxx11::string::~string((string *)&local_3e8);
              std::__cxx11::string::~string((string *)&local_408);
              std::__cxx11::string::~string((string *)&local_428);
              std::__cxx11::string::~string((string *)&local_470);
              std::__cxx11::string::~string((string *)&local_448);
              std::allocator<char>::~allocator(&local_449);
            }
            dVar2 = ::deGetFalse();
          } while (dVar2 != 0);
        }
        StateQueryUtil::verifyStateTextureParamInteger
                  (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   err_2,(this->super_TextureTest).m_type);
      }
    }
    de::Random::~Random((Random *)&ref);
    tcu::ScopedLogSection::~ScopedLogSection(&local_288);
  }
  return;
}

Assistant:

void TextureLevelCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_BASE_LEVEL) ? (0)
								: (m_pname == GL_TEXTURE_MAX_LEVEL)	? (1000)
								: (-1);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	if (m_target == GL_TEXTURE_2D_MULTISAMPLE		||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		// only 0 allowed
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "Set", "Set");

			gl.glTexParameteri(m_target, m_pname, 0);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");
			verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);

			gl.glTexParameterf(m_target, m_pname, 0.0f);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");
			verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
		}
	}
	else
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const int					numIterations	= 20;
		de::Random					rnd				(0xabcdef);

		if (isPureCase)
		{
			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint		ref		= rnd.getInt(0, 64000);
				const GLuint	uRef	= (glw::GLuint)ref;

				if (isPureIntTester(m_tester))
				{
					gl.glTexParameterIiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));
					gl.glTexParameterIuiv(m_target, m_pname, &uRef);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(0, 64000);

				gl.glTexParameteri(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
			}

			// check unit conversions with float

			const float nonSignificantOffsets[] = {-0.45f, -0.25f, 0, 0.45f}; // offsets O so that for any integers z in Z, o in O roundToClosestInt(z+o)==z

			const int numConversionIterations = 30;
			for (int ndx = 0; ndx < numConversionIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(1, 64000);

				for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(nonSignificantOffsets); ++offsetNdx)
				{
					gl.glTexParameterf(m_target, m_pname, ((GLfloat)ref) + nonSignificantOffsets[offsetNdx]);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

					verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
				}
			}
		}
	}
}